

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O2

void nn_cws_start_resolving(nn_cws *self)

{
  char *pcVar1;
  undefined8 uVar2;
  int ipv4only;
  size_t ipv4onlylen;
  
  ipv4onlylen = 4;
  nn_ep_getopt(self->ep,0,0xe,&ipv4only,&ipv4onlylen);
  if (ipv4onlylen == 4) {
    pcVar1 = (char *)nn_chunkref_data(&self->remote_host);
    if (*pcVar1 != '\0') {
      nn_dns_start(&self->dns,pcVar1,self->remote_hostname_len,ipv4only,&self->dns_result);
      self->state = 2;
      return;
    }
    nn_backtrace_print();
    pcVar1 = "strlen (host) > 0";
    uVar2 = 0x24a;
  }
  else {
    nn_backtrace_print();
    pcVar1 = "ipv4onlylen == sizeof (ipv4only)";
    uVar2 = 0x247;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
          ,uVar2);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_cws_start_resolving (struct nn_cws *self)
{
    int ipv4only;
    size_t ipv4onlylen;
    char *host;

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    host = nn_chunkref_data (&self->remote_host);
    nn_assert (strlen (host) > 0);

    nn_dns_start (&self->dns, host, self->remote_hostname_len, ipv4only,
        &self->dns_result);

    self->state = NN_CWS_STATE_RESOLVING;
}